

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O0

int rsa_generate(RSAKey *key,int bits,_Bool strong,PrimeGenerationContext *pgc,
                ProgressReceiver *prog)

{
  RSAPrimeDetails pd_00;
  RSAPrimeDetails pd_01;
  uint uVar1;
  mp_int *x;
  mp_int *a;
  mp_int *b;
  mp_int *x_00;
  mp_int *pmVar2;
  mp_int *pmVar3;
  mp_int *m;
  size_t sVar4;
  mp_int *iqmp;
  mp_int *private_exponent;
  mp_int *phi_n;
  mp_int *qm1;
  mp_int *pm1;
  mp_int *modulus;
  mp_int *q;
  mp_int *p;
  RSAPrimeDetails qd;
  RSAPrimeDetails pd;
  int pbits;
  int qbits;
  mp_int *exponent;
  ProgressReceiver *prog_local;
  PrimeGenerationContext *pgc_local;
  _Bool strong_local;
  int bits_local;
  RSAKey *key_local;
  
  (key->sshk).vt = &ssh_rsa;
  x = mp_from_integer(0x10001);
  pd.phase_p1._4_4_ = bits / 2;
  pd.phase_p1.n = bits - pd.phase_p1._4_4_;
  if (pd.phase_p1.n < (int)pd.phase_p1._4_4_) {
    __assert_fail("pbits >= qbits",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/keygen/rsa.c",
                  0x7d,
                  "int rsa_generate(RSAKey *, int, _Bool, PrimeGenerationContext *, ProgressReceiver *)"
                 );
  }
  setup_rsa_prime((RSAPrimeDetails *)&qd.phase_p1,pd.phase_p1.n,strong,pgc,prog);
  setup_rsa_prime((RSAPrimeDetails *)&p,pd.phase_p1._4_4_,strong,pgc,prog);
  progress_ready(prog);
  invent_firstbits((uint *)&pd.bitsm1,(uint *)&qd.bitsm1,2);
  pd_00._8_8_ = pd._0_8_;
  pd_00._0_8_ = qd.phase_p1.p;
  pd_00.bitsp1 = pd.bitsm1m1;
  pd_00.firstbits = pd.bitsm1;
  pd_00.phase_main = (ProgressPhase)pd._16_8_;
  pd_00.phase_m1m1.p = pd.phase_main.p;
  pd_00.phase_m1.p = pd.phase_m1m1.p;
  pd_00.phase_p1.p = pd.phase_m1.p;
  a = generate_rsa_prime(pd_00,pgc,prog);
  pd_01._8_8_ = qd._0_8_;
  pd_01._0_8_ = p;
  pd_01.bitsp1 = qd.bitsm1m1;
  pd_01.firstbits = qd.bitsm1;
  pd_01.phase_main = (ProgressPhase)qd._16_8_;
  pd_01.phase_m1m1.p = qd.phase_main.p;
  pd_01.phase_m1.p = qd.phase_m1m1.p;
  pd_01.phase_p1.p = qd.phase_m1.p;
  b = generate_rsa_prime(pd_01,pgc,prog);
  if (pd.phase_p1.n == pd.phase_p1._4_4_) {
    uVar1 = mp_cmp_hs(b,a);
    mp_cond_swap(a,b,uVar1);
  }
  else {
    uVar1 = mp_cmp_hs(a,b);
    if (uVar1 == 0) {
      __assert_fail("mp_cmp_hs(p, q)",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/keygen/rsa.c"
                    ,0x92,
                    "int rsa_generate(RSAKey *, int, _Bool, PrimeGenerationContext *, ProgressReceiver *)"
                   );
    }
  }
  x_00 = mp_mul(a,b);
  pmVar2 = mp_copy(a);
  mp_sub_integer_into(pmVar2,pmVar2,1);
  pmVar3 = mp_copy(b);
  mp_sub_integer_into(pmVar3,pmVar3,1);
  m = mp_mul(pmVar2,pmVar3);
  mp_free(pmVar2);
  mp_free(pmVar3);
  pmVar2 = mp_invert(x,m);
  mp_free(m);
  pmVar3 = mp_invert(b,a);
  key->modulus = x_00;
  key->exponent = x;
  key->private_exponent = pmVar2;
  key->p = a;
  key->q = b;
  key->iqmp = pmVar3;
  sVar4 = mp_get_nbits(x_00);
  key->bits = (int)sVar4;
  key->bytes = (key->bits + 7) / 8;
  return 1;
}

Assistant:

int rsa_generate(RSAKey *key, int bits, bool strong,
                 PrimeGenerationContext *pgc, ProgressReceiver *prog)
{
    key->sshk.vt = &ssh_rsa;

    /*
     * We don't generate e; we just use a standard one always.
     */
    mp_int *exponent = mp_from_integer(RSA_EXPONENT);

    /*
     * Generate p and q: primes with combined length `bits', not
     * congruent to 1 modulo e. (Strictly speaking, we wanted (p-1)
     * and e to be coprime, and (q-1) and e to be coprime, but in
     * general that's slightly more fiddly to arrange. By choosing
     * a prime e, we can simplify the criterion.)
     *
     * We give a min_separation of 2 to invent_firstbits(), ensuring
     * that the two primes won't be very close to each other. (The
     * chance of them being _dangerously_ close is negligible - even
     * more so than an attacker guessing a whole 256-bit session key -
     * but it doesn't cost much to make sure.)
     */
    int qbits = bits / 2;
    int pbits = bits - qbits;
    assert(pbits >= qbits);

    RSAPrimeDetails pd = setup_rsa_prime(pbits, strong, pgc, prog);
    RSAPrimeDetails qd = setup_rsa_prime(qbits, strong, pgc, prog);
    progress_ready(prog);

    invent_firstbits(&pd.firstbits, &qd.firstbits, 2);

    mp_int *p = generate_rsa_prime(pd, pgc, prog);
    mp_int *q = generate_rsa_prime(qd, pgc, prog);

    /*
     * Ensure p > q, by swapping them if not.
     *
     * We only need to do this if the two primes were generated with
     * the same number of bits (i.e. if the requested key size is
     * even) - otherwise it's already guaranteed!
     */
    if (pbits == qbits) {
        mp_cond_swap(p, q, mp_cmp_hs(q, p));
    } else {
        assert(mp_cmp_hs(p, q));
    }

    /*
     * Now we have p, q and e. All we need to do now is work out
     * the other helpful quantities: n=pq, d=e^-1 mod (p-1)(q-1),
     * and (q^-1 mod p).
     */
    mp_int *modulus = mp_mul(p, q);
    mp_int *pm1 = mp_copy(p);
    mp_sub_integer_into(pm1, pm1, 1);
    mp_int *qm1 = mp_copy(q);
    mp_sub_integer_into(qm1, qm1, 1);
    mp_int *phi_n = mp_mul(pm1, qm1);
    mp_free(pm1);
    mp_free(qm1);
    mp_int *private_exponent = mp_invert(exponent, phi_n);
    mp_free(phi_n);
    mp_int *iqmp = mp_invert(q, p);

    /*
     * Populate the returned structure.
     */
    key->modulus = modulus;
    key->exponent = exponent;
    key->private_exponent = private_exponent;
    key->p = p;
    key->q = q;
    key->iqmp = iqmp;

    key->bits = mp_get_nbits(modulus);
    key->bytes = (key->bits + 7) / 8;

    return 1;
}